

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveJSON.h
# Opt level: O0

void __thiscall
chrono::ChArchiveOutJSON::out
          (ChArchiveOutJSON *this,
          ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *bVal)

{
  reference pvVar1;
  ChStreamOutAscii *pCVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  reference pvVar5;
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *bVal_local;
  ChArchiveOutJSON *this_local;
  
  comma_cr(this);
  indent(this);
  pvVar1 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::top(&this->is_array);
  if ((*pvVar1 & 1U) == 0) {
    pCVar2 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"");
    pcVar3 = ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::name(bVal);
    pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,pcVar3);
    pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"\"");
    chrono::ChStreamOutAscii::operator<<(pCVar2,"\t: ");
  }
  pCVar2 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"");
  pbVar4 = ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::value(bVal);
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,(string *)pbVar4);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\"");
  pvVar5 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->nitems);
  *pvVar5 = *pvVar5 + 1;
  return;
}

Assistant:

virtual void out     (ChNameValue<std::string> bVal){
            comma_cr();
            indent();
            if (is_array.top()==false)
                (*ostream) << "\"" << bVal.name() << "\"" << "\t: ";
            (*ostream) << "\"" << bVal.value() << "\"";
            ++nitems.top();
      }